

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

char * lua_getlocal(lua_State *L,lua_Debug *ar,int n)

{
  TValue *pTVar1;
  ulong uVar2;
  char *pcVar3;
  char *name;
  char *local_18;
  
  local_18 = (char *)0x0;
  if (ar == (lua_Debug *)0x0) {
    if ((L->top[-1].field_4.it >> 0xf == 0x1fff7) &&
       (uVar2 = (ulong)L->top[-1].field_4 & 0x7fffffffffff, *(char *)(uVar2 + 10) == '\0')) {
      pcVar3 = debug_varname((GCproto *)(*(long *)(uVar2 + 0x20) + -0x68),0,n - 1);
      return pcVar3;
    }
  }
  else {
    pTVar1 = debug_localname(L,ar,&local_18,n);
    pcVar3 = local_18;
    if (local_18 != (char *)0x0) {
      *L->top = *pTVar1;
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      if (pTVar1 + 1 < (TValue *)(L->maxstack).ptr64) {
        return local_18;
      }
      lj_state_growstack1(L);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

LUA_API const char *lua_getlocal(lua_State *L, const lua_Debug *ar, int n)
{
  const char *name = NULL;
  if (ar) {
    TValue *o = debug_localname(L, ar, &name, (BCReg)n);
    if (name) {
      copyTV(L, L->top, o);
      incr_top(L);
    }
  } else if (tvisfunc(L->top-1) && isluafunc(funcV(L->top-1))) {
    name = debug_varname(funcproto(funcV(L->top-1)), 0, (BCReg)n-1);
  }
  return name;
}